

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

void Acb_NtkUpdateTiming(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *local_40;
  Vec_Int_t *vTfo;
  Vec_Int_t *vTfi;
  int nPaths2;
  int nPaths1;
  int LevelR;
  int LevelD;
  int LevelMax;
  int Entry;
  int i;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  iVar2 = p->LevelMax;
  vTfo = Acb_ObjCollectTfi(p,iObj,1);
  local_40 = Acb_ObjCollectTfo(p,iObj,1);
  if (0 < iObj) {
    iVar1 = Vec_IntEntryLast(vTfo);
    if (iVar1 != iObj) {
      __assert_fail("Vec_IntEntryLast(vTfi) == iObj",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                    ,0x162,"void Acb_NtkUpdateTiming(Acb_Ntk_t *, int)");
    }
    iVar1 = Vec_IntEntryLast(local_40);
    if (iVar1 != iObj) {
      __assert_fail("Vec_IntEntryLast(vTfo) == iObj",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                    ,0x163,"void Acb_NtkUpdateTiming(Acb_Ntk_t *, int)");
    }
    Vec_IntPop(local_40);
  }
  Acb_NtkComputeLevelD(p,local_40);
  iVar1 = p->LevelMax;
  Acb_NtkComputeLevelR(p,vTfo);
  if (iVar1 != p->LevelMax) {
    __assert_fail("LevelD == LevelR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                  ,0x16a,"void Acb_NtkUpdateTiming(Acb_Ntk_t *, int)");
  }
  Entry = iObj;
  if ((0 < iObj) && (p->LevelMax < iVar2)) {
    Entry = -1;
    vTfo = Acb_ObjCollectTfi(p,-1,1);
    local_40 = Acb_ObjCollectTfo(p,-1,1);
    Vec_QueClear(p->vQue);
  }
  if (0 < Entry) {
    Acb_NtkComputePathsD(p,vTfo,0);
  }
  Acb_NtkComputePathsD(p,local_40,1);
  iVar2 = p->nPaths;
  if (0 < Entry) {
    Acb_NtkComputePathsR(p,local_40,0);
  }
  Acb_NtkComputePathsR(p,vTfo,1);
  if (iVar2 == p->nPaths) {
    for (LevelMax = 0; iVar2 = Vec_IntSize(vTfo), LevelMax < iVar2; LevelMax = LevelMax + 1) {
      iVar2 = Vec_IntEntry(vTfo,LevelMax);
      Acb_ObjUpdatePriority(p,iVar2);
    }
    if (0 < Entry) {
      for (LevelMax = 0; iVar2 = Vec_IntSize(local_40), LevelMax < iVar2; LevelMax = LevelMax + 1) {
        iVar2 = Vec_IntEntry(local_40,LevelMax);
        Acb_ObjUpdatePriority(p,iVar2);
      }
    }
    return;
  }
  __assert_fail("nPaths1 == nPaths2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                ,0x17b,"void Acb_NtkUpdateTiming(Acb_Ntk_t *, int)");
}

Assistant:

void Acb_NtkUpdateTiming( Acb_Ntk_t * p, int iObj )
{
    int i, Entry, LevelMax = p->LevelMax;
    int LevelD, LevelR, nPaths1, nPaths2;
    // assuming that direct level of the new nodes (including iObj) is up to date
    Vec_Int_t * vTfi = Acb_ObjCollectTfi( p, iObj, 1 );
    Vec_Int_t * vTfo = Acb_ObjCollectTfo( p, iObj, 1 );
    if ( iObj > 0 )
    {
        assert( Vec_IntEntryLast(vTfi) == iObj );
        assert( Vec_IntEntryLast(vTfo) == iObj );
        Vec_IntPop( vTfo );
    }
    Acb_NtkComputeLevelD( p, vTfo );
    LevelD = p->LevelMax;
    Acb_NtkComputeLevelR( p, vTfi );
    LevelR = p->LevelMax;
    assert( LevelD == LevelR );
    if ( iObj > 0 && LevelMax > p->LevelMax ) // reduced level
    {
        iObj = -1;
        vTfi = Acb_ObjCollectTfi( p, -1, 1 );
        vTfo = Acb_ObjCollectTfo( p, -1, 1 );   
        Vec_QueClear( p->vQue );
        // add backup here
    }
    if ( iObj > 0 )
    Acb_NtkComputePathsD( p, vTfi, 0 );
    Acb_NtkComputePathsD( p, vTfo, 1 );
    nPaths1 = p->nPaths;
    if ( iObj > 0 )
    Acb_NtkComputePathsR( p, vTfo, 0 );
    Acb_NtkComputePathsR( p, vTfi, 1 );
    nPaths2 = p->nPaths;
    assert( nPaths1 == nPaths2 );
    Vec_IntForEachEntry( vTfi, Entry, i )
        Acb_ObjUpdatePriority( p, Entry );
    if ( iObj > 0 )
    Vec_IntForEachEntry( vTfo, Entry, i )
        Acb_ObjUpdatePriority( p, Entry );

//    printf( "Updating timing for object %d.\n", iObj );
//    Acb_NtkPrintPaths( p );
//    while ( (Entry = (int)Vec_QueTopPriority(p->vQue)) > 0 )
//        printf( "Obj = %5d : Prio = %d.\n", Vec_QuePop(p->vQue), Entry );
}